

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O0

int net_tcp4_listen_socket(char *hostname,unsigned_short port)

{
  int iVar1;
  uchar local_1e [2];
  int sock;
  uchar ip [4];
  char *pcStack_18;
  unsigned_short port_local;
  char *hostname_local;
  
  sock._2_2_ = port;
  pcStack_18 = hostname;
  iVar1 = net_ip4_resolve_hostname(hostname,port,local_1e,(sockaddr_in *)0x0);
  if (iVar1 == 0) {
    memset(local_1e,0,4);
  }
  hostname_local._4_4_ = net_tcp4_nonblock_socket();
  if (((hostname_local._4_4_ < 0) ||
      (iVar1 = net_tcp4_bind_reuse(hostname_local._4_4_,local_1e,sock._2_2_), iVar1 < 0)) ||
     (iVar1 = listen(hostname_local._4_4_,0x10), iVar1 < 0)) {
    hostname_local._4_4_ = -1;
  }
  return hostname_local._4_4_;
}

Assistant:

int net_tcp4_listen_socket(char *hostname, unsigned short port) {
  unsigned char ip[4];
  if (!net_ip4_resolve_hostname(hostname, port, ip, NULL))
    memset(ip, 0, sizeof(ip));
  
  int sock;
  if (((sock = net_tcp4_nonblock_socket()) < 0) ||
      (net_tcp4_bind_reuse(sock, ip, port) < 0) ||
      (listen(sock, 16) < 0)) {
    return -1;
  }

  return sock;
}